

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  ImVec2 IVar1;
  int iVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiID IVar7;
  ImGuiContext *g;
  
  pIVar5 = GImGui;
  IVar7 = ImGuiWindow::GetID(GImGui->CurrentWindow,name,(char *)0x0);
  pIVar4 = GImGui;
  iVar2 = (GImGui->BeginPopupStack).Size;
  if ((iVar2 < (GImGui->OpenPopupStack).Size) &&
     ((GImGui->OpenPopupStack).Data[iVar2].PopupId == IVar7)) {
    if ((pIVar5->NextWindowData).PosCond == 0) {
      IVar1 = (pIVar5->IO).DisplaySize;
      IVar3.y = IVar1.y * 0.5;
      IVar3.x = IVar1.x * 0.5;
      (GImGui->NextWindowData).PosVal = IVar3;
      (pIVar4->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar4->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar4->NextWindowData).PosCond = 8;
    }
    bVar6 = Begin(name,p_open,flags | 0xc000120);
    if (bVar6) {
      if (p_open == (bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      NavMoveRequestTryWrapping(GImGui->CurrentWindow,2);
      End();
      ClosePopupToLevel((pIVar5->BeginPopupStack).Size,true);
    }
    else {
      NavMoveRequestTryWrapping(GImGui->CurrentWindow,2);
      End();
    }
  }
  else {
    (pIVar5->NextWindowData).CollapsedCond = 0;
    (pIVar5->NextWindowData).SizeConstraintCond = 0;
    (pIVar5->NextWindowData).FocusCond = 0;
    (pIVar5->NextWindowData).BgAlphaCond = 0;
    (pIVar5->NextWindowData).PosCond = 0;
    (pIVar5->NextWindowData).SizeCond = 0;
    (pIVar5->NextWindowData).ContentSizeCond = 0;
    (pIVar5->NextWindowData).CollapsedCond = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id))
    {
        g.NextWindowData.Clear(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if (g.NextWindowData.PosCond == 0)
        SetNextWindowPos(g.IO.DisplaySize * 0.5f, ImGuiCond_Appearing, ImVec2(0.5f, 0.5f));

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}